

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.h
# Opt level: O3

void __thiscall chrono::robosimian::LinkData::~LinkData(LinkData *this)

{
  pointer pCVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pCVar1 = (this->link).m_shapes.
           super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1,(long)(this->link).m_shapes.
                                 super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar1);
  }
  pcVar2 = (this->link).m_mesh_name._M_dataplus._M_p;
  paVar3 = &(this->link).m_mesh_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar3 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

struct CH_MODELS_API LinkData {
    LinkData(std::string myname, Link mylink, bool inc) : name(myname), link(mylink), include(inc) {}
    ////LinkData(LinkData&&) {}

    std::string name;
    Link link;
    bool include;
}